

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void * lua_upvalueid(lua_State *L,int fidx,int n)

{
  TValue *pTVar1;
  void *pvVar2;
  uint uVar3;
  
  pTVar1 = index2addr(L,fidx);
  uVar3 = pTVar1->tt_ & 0x3f;
  if (uVar3 == 0x26) {
    pvVar2 = (void *)((long)(pTVar1->value_).gc + (long)n * 0x10 + 0x10);
  }
  else if (uVar3 == 6) {
    pTVar1 = index2addr(L,fidx);
    pvVar2 = *(void **)((pTVar1->value_).f + (long)n * 8 + 0x18);
  }
  else {
    pvVar2 = (void *)0x0;
  }
  return pvVar2;
}

Assistant:

LUA_API void *lua_upvalueid (lua_State *L, int fidx, int n) {
  StkId fi = index2addr(L, fidx);
  switch (ttype(fi)) {
    case LUA_TLCL: {  /* lua closure */
      return *getupvalref(L, fidx, n, NULL);
    }
    case LUA_TCCL: {  /* C closure */
      CClosure *f = clCvalue(fi);
      api_check(L, 1 <= n && n <= f->nupvalues, "invalid upvalue index");
      return &f->upvalue[n - 1];
    }
    default: {
      api_check(L, 0, "closure expected");
      return NULL;
    }
  }
}